

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

BCLine lj_debug_frameline(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  BCPos pc;
  BCLine BVar1;
  
  pc = debug_framepc(L,fn,nextframe);
  if (pc != 0xffffffff) {
    BVar1 = lj_debug_line((GCproto *)((ulong)(fn->c).pc.ptr32 - 0x40),pc);
    return BVar1;
  }
  return -1;
}

Assistant:

BCLine lj_debug_frameline(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    lj_assertL(pc <= pt->sizebc, "PC out of range");
    return lj_debug_line(pt, pc);
  }
  return -1;
}